

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

void __thiscall FParser::EvaluateExpression(FParser *this,svalue_t *result,int start,int stop)

{
  char *value;
  int stop_00;
  int start_00;
  int iVar1;
  FString *this_00;
  undefined8 extraout_RAX;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  long lVar3;
  long lVar4;
  long *plVar5;
  FString tempstr;
  int local_48;
  int local_44;
  svalue_t *local_40;
  FString local_38;
  
  local_48 = stop;
  local_44 = start;
  if ((this->TokenType[start] == operator_) && (this->TokenType[stop] == operator_)) {
    PointlessBrackets(this,&local_44,&local_48);
  }
  start_00 = local_44;
  stop_00 = local_48;
  lVar3 = (long)local_44;
  if (local_44 == local_48) {
    SimpleEvaluate(this,result,local_44);
    return;
  }
  lVar4 = (long)num_operators;
  local_40 = result;
  if (0 < lVar4) {
    lVar2 = 0;
    do {
      value = *(char **)((long)&operators[0].string + lVar2);
      if (*(int *)((long)&operators[0].direction + lVar2) == 0) {
        iVar1 = FindOperatorBackwards(this,start_00,stop_00,value);
      }
      else {
        iVar1 = FindOperator(this,start_00,stop_00,value);
      }
      if (iVar1 != -1) {
        UNRECOVERED_JUMPTABLE = *(code **)((long)&operators[0].handler + lVar2);
        plVar5 = (long *)((long)this->Tokens + *(long *)(&operators[0].field_0x10 + lVar2) + -0x10);
        if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar5 + -1);
        }
        (*UNRECOVERED_JUMPTABLE)(plVar5,local_40,start_00,iVar1,stop_00,UNRECOVERED_JUMPTABLE);
        return;
      }
      lVar2 = lVar2 + 0x20;
    } while (lVar4 * 0x20 != lVar2);
  }
  if (this->TokenType[lVar3] == function) {
    EvaluateFunction(this,local_40,start_00,stop_00);
    return;
  }
  local_38.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if (start_00 <= stop_00) {
    lVar4 = 0;
    do {
      this_00 = FString::operator+=(&local_38,this->Tokens[lVar3 + lVar4]);
      FString::operator+=(this_00,' ');
      lVar4 = lVar4 + 1;
    } while ((stop_00 - start_00) + 1 != (int)lVar4);
  }
  script_error("couldnt evaluate expression: %s\n",local_38.Chars);
  FString::~FString(&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void FParser::EvaluateExpression(svalue_t &result, int start, int stop)
{
	int i, n;
	
	// possible pointless brackets
	if(TokenType[start] == operator_ && TokenType[stop] == operator_)
		PointlessBrackets(&start, &stop);

	if(start == stop)       // only 1 thing to evaluate
    {
		SimpleEvaluate(result, start);
		return;
    }
	
	// go through each operator in order of precedence
	for(i=0; i<num_operators; i++)
    {
		// check backwards for the token. it has to be
		// done backwards for left-to-right reading: eg so
		// 5-3-2 is (5-3)-2 not 5-(3-2)
		
		if (operators[i].direction==forward)
		{
			n = FindOperatorBackwards(start, stop, operators[i].string);
		}
		else
		{
			n = FindOperator(start, stop, operators[i].string);
		}

		if( n != -1)
		{
			// call the operator function and evaluate this chunk of tokens
			(this->*operators[i].handler)(result, start, n, stop);
			return;
		}
    }
	
	if(TokenType[start] == function)
	{
		EvaluateFunction(result, start, stop);
		return;
	}
	
	// error ?
	{        
		FString tempstr;
		
		for(i=start; i<=stop; i++) tempstr << Tokens[i] << ' ';
		script_error("couldnt evaluate expression: %s\n",tempstr.GetChars());
	}
}